

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

QComboBoxPrivateContainer * __thiscall QComboBoxPrivate::viewContainer(QComboBoxPrivate *this)

{
  bool bVar1;
  QComboBoxPrivate *this_00;
  QComboBoxPrivateContainer *pQVar2;
  QAbstractItemView *pQVar3;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QComboBox *q;
  QComboBoxPrivateContainer *in_stack_ffffffffffffff18;
  TextElideMode mode;
  QComboBoxListView *in_stack_ffffffffffffff20;
  QComboBoxPrivate *in_stack_ffffffffffffff28;
  QComboBoxPrivate *in_stack_ffffffffffffff40;
  Connection *this_01;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff70;
  ConnectionType type;
  Object *in_stack_ffffffffffffff78;
  code *receiverPrivate;
  Object *in_stack_ffffffffffffff80;
  Object *sender;
  QComboBoxPrivate *slot;
  QComboBox *in_stack_ffffffffffffffa8;
  QAbstractItemView *in_stack_ffffffffffffffb0;
  QComboBoxPrivate *in_stack_ffffffffffffffb8;
  Connection local_40;
  code *local_38;
  undefined8 uStack_30;
  Connection local_28;
  code *local_20;
  undefined8 uStack_18;
  Connection local_10;
  long local_8;
  
  type = (ConnectionType)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  slot = in_RDI;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QComboBoxPrivateContainer> *)0x53298d);
  if (bVar1) {
    pQVar2 = ::QPointer::operator_cast_to_QComboBoxPrivateContainer_
                       ((QPointer<QComboBoxPrivateContainer> *)0x5329a4);
  }
  else {
    q_func(in_RDI);
    operator_new(0x80);
    this_00 = (QComboBoxPrivate *)operator_new(0x30);
    QComboBoxListView::QComboBoxListView
              (in_stack_ffffffffffffff20,(QComboBox *)in_stack_ffffffffffffff18);
    QComboBoxPrivateContainer::QComboBoxPrivateContainer
              ((QComboBoxPrivateContainer *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    QPointer<QComboBoxPrivateContainer>::operator=
              ((QPointer<QComboBoxPrivateContainer> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
    mode = (TextElideMode)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    disconnectModel(this_00);
    pQVar2 = QPointer<QComboBoxPrivateContainer>::operator->
                       ((QPointer<QComboBoxPrivateContainer> *)0x532a37);
    pQVar3 = QComboBoxPrivateContainer::itemView(pQVar2);
    (**(code **)(*(long *)&(pQVar3->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1c8))
              (pQVar3,in_RDI->model);
    connectModel(in_stack_ffffffffffffffb8);
    pQVar2 = QPointer<QComboBoxPrivateContainer>::operator->
                       ((QPointer<QComboBoxPrivateContainer> *)0x532a6e);
    QComboBoxPrivateContainer::itemView(pQVar2);
    QAbstractItemView::setTextElideMode((QAbstractItemView *)in_stack_ffffffffffffff20,mode);
    updateDelegate((QComboBoxPrivate *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                   ,SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
    updateLayoutDirection(in_stack_ffffffffffffff28);
    updateViewContainerPaletteAndOpacity(in_stack_ffffffffffffff40);
    ::QPointer::operator_cast_to_QComboBoxPrivateContainer_
              ((QPointer<QComboBoxPrivateContainer> *)0x532ab0);
    local_20 = itemSelected;
    uStack_18 = 0;
    pQVar3 = (QAbstractItemView *)0x0;
    this_01 = &local_10;
    QObjectPrivate::
    connect<void(QComboBoxPrivateContainer::*)(QModelIndex_const&),void(QComboBoxPrivate::*)(QModelIndex_const&)>
              (in_stack_ffffffffffffff80,
               (offset_in_QComboBoxPrivateContainer_to_subr)in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffff78,(Function)slot,type);
    QMetaObject::Connection::~Connection(this_01);
    pQVar2 = QPointer<QComboBoxPrivateContainer>::operator->
                       ((QPointer<QComboBoxPrivateContainer> *)0x532b2e);
    QComboBoxPrivateContainer::itemView(pQVar2);
    QAbstractItemView::selectionModel(pQVar3);
    receiverPrivate = QItemSelectionModel::currentChanged;
    sender = (Object *)0x0;
    local_38 = emitHighlighted;
    uStack_30 = 0;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QComboBoxPrivate::*)(QModelIndex_const&)>
              ((Object *)0x0,(offset_in_QItemSelectionModel_to_subr)in_stack_ffffffffffffffb0,
               (Object *)QItemSelectionModel::currentChanged,(Function)slot,type);
    QMetaObject::Connection::~Connection(&local_28);
    ::QPointer::operator_cast_to_QComboBoxPrivateContainer_
              ((QPointer<QComboBoxPrivateContainer> *)0x532bb9);
    QObjectPrivate::connect<void(QComboBoxPrivateContainer::*)(),void(QComboBoxPrivate::*)()>
              (sender,0x535cf0,(Object *)receiverPrivate,(Function)slot,AutoConnection);
    QMetaObject::Connection::~Connection(&local_40);
    pQVar2 = ::QPointer::operator_cast_to_QComboBoxPrivateContainer_
                       ((QPointer<QComboBoxPrivateContainer> *)0x532c41);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QComboBoxPrivateContainer* QComboBoxPrivate::viewContainer()
{
    if (container)
        return container;

    Q_Q(QComboBox);
    container = new QComboBoxPrivateContainer(new QComboBoxListView(q), q);
    disconnectModel();
    container->itemView()->setModel(model);
    connectModel();
    container->itemView()->setTextElideMode(Qt::ElideMiddle);
    updateDelegate(true);
    updateLayoutDirection();
    updateViewContainerPaletteAndOpacity();
    QObjectPrivate::connect(container, &QComboBoxPrivateContainer::itemSelected,
                            this, &QComboBoxPrivate::itemSelected);
    QObjectPrivate::connect(container->itemView()->selectionModel(),
                            &QItemSelectionModel::currentChanged,
                            this, &QComboBoxPrivate::emitHighlighted);
    QObjectPrivate::connect(container, &QComboBoxPrivateContainer::resetButton,
                            this, &QComboBoxPrivate::resetButton);
    return container;
}